

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O1

unique_ptr<Cryptor,_std::default_delete<Cryptor>_> __thiscall
Cryptor::cryptor_factory(Cryptor *this,bool mode,Cryptors type,string *message)

{
  bool bVar1;
  HuffmanEncoder *this_00;
  Lz77Encoder *this_01;
  Lz77Decoder *this_02;
  runtime_error *this_03;
  pointer __p;
  __uniq_ptr_impl<Lz77Encoder,_std::default_delete<Lz77Encoder>_> local_20;
  
  bVar1 = !mode;
  if (type != Huffman || bVar1) {
    if (type != Huffman || mode) {
      if (type == Lz77 && !bVar1) {
        this_01 = (Lz77Encoder *)operator_new(0x50);
        Lz77Encoder::Lz77Encoder(this_01,message);
        local_20._M_t.super__Tuple_impl<0UL,_Lz77Encoder_*,_std::default_delete<Lz77Encoder>_>.
        super__Head_base<0UL,_Lz77Encoder_*,_false>._M_head_impl =
             (tuple<Lz77Encoder_*,_std::default_delete<Lz77Encoder>_>)
             (_Tuple_impl<0UL,_Lz77Encoder_*,_std::default_delete<Lz77Encoder>_>)0x0;
        this->_vptr_Cryptor = (_func_int **)this_01;
        std::unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_>::~unique_ptr
                  ((unique_ptr<Lz77Encoder,_std::default_delete<Lz77Encoder>_> *)&local_20);
        return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
               (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
      }
      if (type == Lz77 && !mode) {
        this_02 = (Lz77Decoder *)operator_new(0x50);
        Lz77Decoder::Lz77Decoder(this_02,message);
        local_20._M_t.super__Tuple_impl<0UL,_Lz77Encoder_*,_std::default_delete<Lz77Encoder>_>.
        super__Head_base<0UL,_Lz77Encoder_*,_false>._M_head_impl =
             (tuple<Lz77Encoder_*,_std::default_delete<Lz77Encoder>_>)
             (_Tuple_impl<0UL,_Lz77Encoder_*,_std::default_delete<Lz77Encoder>_>)0x0;
        this->_vptr_Cryptor = (_func_int **)this_02;
        std::unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_>::~unique_ptr
                  ((unique_ptr<Lz77Decoder,_std::default_delete<Lz77Decoder>_> *)&local_20);
        return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
               (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
      }
      if (type != Deflate || bVar1) {
        if (type != Deflate || mode) {
          this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_03,"Not implemented factory case");
          __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_00 = (HuffmanEncoder *)operator_new(0x50);
        DeflateDecoder::DeflateDecoder((DeflateDecoder *)this_00,message);
      }
      else {
        this_00 = (HuffmanEncoder *)operator_new(0x50);
        DeflateEncoder::DeflateEncoder((DeflateEncoder *)this_00,message);
      }
    }
    else {
      this_00 = (HuffmanEncoder *)operator_new(0x68);
      HuffmanDecoder::HuffmanDecoder((HuffmanDecoder *)this_00,message);
    }
  }
  else {
    this_00 = (HuffmanEncoder *)operator_new(0xb8);
    HuffmanEncoder::HuffmanEncoder(this_00,message);
  }
  this->_vptr_Cryptor = (_func_int **)this_00;
  return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
         (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cryptor> Cryptor::cryptor_factory(
  const bool mode,
  const Cryptors type,
  const std::string& message
) {
  if (mode &&
    type == Cryptors::Huffman) {
    return std::unique_ptr<Cryptor>(std::make_unique<HuffmanEncoder>(message));
  }
  if (!mode &&
    type == Cryptors::Huffman) {
    return std::unique_ptr<Cryptor>(std::make_unique<HuffmanDecoder>(message));
  }
  if (mode &&
    type == Cryptors::Lz77) {
    return std::unique_ptr<Cryptor>(std::make_unique<Lz77Encoder>(message));
  }
  if (!mode &&
    type == Cryptors::Lz77) {
    return std::unique_ptr<Cryptor>(std::make_unique<Lz77Decoder>(message));

  }
  if (mode &&
    type == Cryptors::Deflate) {
    return std::unique_ptr<Cryptor>(std::make_unique<DeflateEncoder>(message));
  }
  if (!mode &&
    type == Cryptors::Deflate) {
    return std::unique_ptr<Cryptor>(std::make_unique<DeflateDecoder>(message));
  }

  throw runtime_error("Not implemented factory case");
}